

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O2

void __thiscall Personality::PrintPersonality(Personality *this)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  _Self __tmp_1;
  _List_node_base *p_Var4;
  _Self __tmp;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cost: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->cost);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Personality Type: ");
  uVar1 = this->typeP - ATTACKER;
  if (uVar1 < 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             &DAT_0010e788 + *(int *)(&DAT_0010e788 + (ulong)uVar1 * 4));
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "Tapped: no";
    if (this->tapped != false) {
      pcVar3 = "Tapped: yes";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "Revealed: no";
    if (this->revealed != false) {
      pcVar3 = "Revealed: yes";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Attack: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->attack);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Defense: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->defense);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Honour: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->honour);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Maximum possible followers: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->maxFollowers);
    std::endl<char,std::char_traits<char>>(poVar2);
    p_Var4 = (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->followers) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No followers");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      for (; p_Var4 != (_List_node_base *)&this->followers; p_Var4 = p_Var4->_M_next) {
        Follower::PrintFollower((Follower *)p_Var4[1]._M_next);
      }
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Maximum possible items: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->maxItems);
    std::endl<char,std::char_traits<char>>(poVar2);
    p_Var4 = (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->items) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No followers");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      for (; p_Var4 != (_List_node_base *)&this->items; p_Var4 = p_Var4->_M_next) {
        Item::PrintItem((Item *)p_Var4[1]._M_next);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void Personality::PrintPersonality()                                //prints personality's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Personality Type: ";
    if (typeP == ATTACKER)
        cout << "Attacker" << endl;
    else if (typeP == DEFENDER)
        cout << "Defender" << endl;
    else if (typeP == SHOGUN)
        cout << "Shogun" << endl;
    else if (typeP == CHANCELLOR)
        cout << "Chancellor" << endl;
    else if (typeP == CHAMPION)
        cout << "Champion" << endl;
    else
        return;

    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Attack: " << attack << endl;
    cout << "Defense: " << defense << endl;
    cout << "Honour: " << honour << endl;

    cout << "Maximum possible followers: " << maxFollowers << endl;

    list<Follower*>::iterator itf;

    if (followers.empty())
        cout << "No followers" << endl;
    else
    {
        for (itf=followers.begin(); itf!=followers.end(); itf++)
            (*itf)->PrintFollower();
    }

    cout << "Maximum possible items: " << maxItems << endl;

    list<Item*>::iterator iti;

    if (items.empty())
        cout << "No followers" << endl;
    else
    {
        for (iti=items.begin(); iti!=items.end(); iti++)
            (*iti)->PrintItem();
    }
    cout << endl;
}